

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_seek_start(stb_vorbis *f)

{
  vorb *in_RDI;
  stb_vorbis *in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI->push_mode == '\0') {
    set_file_offset(in_stack_ffffffffffffffe8,0);
    in_RDI->previous_length = 0;
    in_RDI->first_decode = '\x01';
    in_RDI->next_seg = -1;
    local_4 = vorbis_pump_first_frame(in_RDI);
  }
  else {
    local_4 = error(in_RDI,VORBIS_invalid_api_mixing);
  }
  return local_4;
}

Assistant:

int stb_vorbis_seek_start(stb_vorbis *f)
{
   if (IS_PUSH_MODE(f)) { return error(f, VORBIS_invalid_api_mixing); }
   set_file_offset(f, f->first_audio_page_offset);
   f->previous_length = 0;
   f->first_decode = TRUE;
   f->next_seg = -1;
   return vorbis_pump_first_frame(f);
}